

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack17_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = *in;
  auVar7 = vpmovsxbd_avx(ZEXT416(0x1000004));
  uVar2 = in[3];
  uVar3 = in[4];
  *out = uVar1 & 0x1ffff;
  uVar4 = *(ulong *)(in + 1);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar4;
  auVar8 = vpsllvd_avx2(auVar9,_DAT_0019d890);
  auVar6._8_4_ = 0x18000;
  auVar6._0_8_ = 0x1e00000018000;
  auVar6._12_4_ = 0x1e000;
  auVar6 = vpandq_avx512vl(auVar8,auVar6);
  auVar7 = vpermi2d_avx512vl(auVar7,auVar9,ZEXT416(uVar1));
  auVar8 = vpsrlvd_avx2(auVar7,_DAT_0019d8b0);
  auVar7 = vpmovzxdq_avx(auVar6);
  auVar7 = vpor_avx(auVar8,auVar7);
  auVar5._8_4_ = 0x1ffff;
  auVar5._0_8_ = 0x1ffff0001ffff;
  auVar5._12_4_ = 0x1ffff;
  auVar8 = vpandd_avx512vl(auVar8,auVar5);
  auVar7 = vpblendd_avx2(auVar7,auVar8,10);
  *(undefined1 (*) [16])(out + 1) = auVar7;
  out[5] = (uint)(uVar4 >> 0x35) | (uVar2 & 0x3f) << 0xb;
  out[6] = uVar2 >> 6 & 0x1ffff;
  out[7] = (uVar3 & 0xff) << 9 | uVar2 >> 0x17;
  return in + 5;
}

Assistant:

const uint32_t *__fastunpack17_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 2)) << (17 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 17);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 4)) << (17 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 17);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 6)) << (17 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 17);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 8)) << (17 - 8);
  out++;

  return in + 1;
}